

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaWMR.cpp
# Opt level: O0

void __thiscall NaWMR::SetParameters(NaWMR *this,NaParams *params)

{
  char *pcVar1;
  NaParams *in_RSI;
  char *in_RDI;
  double dVar2;
  
  pcVar1 = NaParams::operator()(in_RSI,in_RDI);
  dVar2 = atof(pcVar1);
  *(double *)(in_RDI + 0x58) = dVar2;
  pcVar1 = NaParams::operator()(in_RSI,in_RDI);
  dVar2 = atof(pcVar1);
  *(double *)(in_RDI + 0x60) = dVar2;
  pcVar1 = NaParams::operator()(in_RSI,in_RDI);
  dVar2 = atof(pcVar1);
  *(double *)(in_RDI + 0x68) = dVar2;
  pcVar1 = NaParams::operator()(in_RSI,in_RDI);
  dVar2 = atof(pcVar1);
  *(double *)(in_RDI + 0x70) = dVar2;
  pcVar1 = NaParams::operator()(in_RSI,in_RDI);
  dVar2 = atof(pcVar1);
  *(double *)(in_RDI + 0x78) = dVar2;
  pcVar1 = NaParams::operator()(in_RSI,in_RDI);
  dVar2 = atof(pcVar1);
  *(double *)(in_RDI + 0x80) = dVar2;
  pcVar1 = NaParams::operator()(in_RSI,in_RDI);
  dVar2 = atof(pcVar1);
  *(double *)(in_RDI + 0x88) = dVar2;
  pcVar1 = NaParams::operator()(in_RSI,in_RDI);
  dVar2 = atof(pcVar1);
  *(double *)(in_RDI + 0x90) = dVar2;
  pcVar1 = NaParams::operator()(in_RSI,in_RDI);
  dVar2 = atof(pcVar1);
  *(double *)(in_RDI + 0x98) = dVar2;
  pcVar1 = NaParams::operator()(in_RSI,in_RDI);
  dVar2 = atof(pcVar1);
  *(double *)(in_RDI + 0xa0) = dVar2;
  return;
}

Assistant:

void
NaWMR::SetParameters (const NaParams& params)
{
  par.l = atof(params("base_length"));	/**< distance between motor wheels */
  par.b = atof(params("mass_offset"));	/**< distance between wheels axis and
					   center of mass */
  par.r = atof(params("wheel_radius"));	/**< radius of the wheel */
  par.m = atof(params("total_mass"));	/**< mass of the robot */
  par.iz = atof(params("inertia_z"));	/**< moment of inertia of the robot
					   around vertical axis */
  par.R = atof(params("motor_resist"));	/**< electic resistance */
  par.L = atof(params("motor_induct"));	/**< induction */
  par.Kw = atof(params("motor_Kw"));	/**< coefficient 1 */
  par.Km = atof(params("motor_Km"));	/**< coefficient 2 */
  par.i = atof(params("reductor_ratio"));/**< reductor ratio */
}